

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

double runnameAndTorsion(xformDatabase *xdb,char *buf,int max)

{
  int iVar1;
  biasFunction *pbVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_48;
  
  local_48 = 0.0;
  if ((buf != (char *)0x0 && xdb != (xformDatabase *)0x0) && (0 < xdb->nlevs)) {
    local_48 = 0.0;
    lVar3 = 0;
    do {
      if (0xf < max) {
        iVar1 = sprintf(buf,"%g ",xdb->level[lVar3]->currVal);
        buf = buf + iVar1;
        max = max - iVar1;
      }
      for (pbVar2 = xdb->level[lVar3]->funcs; pbVar2 != (biasFunction *)0x0; pbVar2 = pbVar2->next)
      {
        iVar1 = pbVar2->type;
        if (iVar1 == 2) {
          dVar6 = pbVar2->v;
          dVar5 = pow(xdb->level[lVar3]->currVal - pbVar2->ph,pbVar2->freq);
          local_48 = local_48 + dVar5 * dVar6;
        }
        else {
          if (iVar1 == 1) {
            dVar6 = pbVar2->v;
            dVar5 = pbVar2->shift;
            dVar4 = cos((xdb->level[lVar3]->currVal - pbVar2->ph) * pbVar2->freq * 0.017453293);
            dVar6 = (dVar5 - dVar4) * dVar6 * 0.5;
          }
          else {
            if (iVar1 != 0) goto LAB_00121e6d;
            dVar6 = pbVar2->v;
          }
          local_48 = local_48 + dVar6;
        }
LAB_00121e6d:
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < xdb->nlevs);
  }
  return local_48;
}

Assistant:

double runnameAndTorsion(xformDatabase* xdb, char* buf, int max) {
   char *p = NULL;
   int i = 0, n = 0;
   double bias = 0.0, phi = 0.0;
   biasFunction *f = NULL;

   if (xdb && buf) {
      bias = 0.0;
      p = buf; /*dcr?: (dcr guesses) that p now points to beginning of buf */
      for(i = 0; i < xdb->nlevs; i++) {
	 if (max > 15) { /* add value to the output buffer */
	    n = sprintf(p, "%g ", xdb->level[i]->currVal);
	            /*dcr?: that sprintf wrote n char into buf starting at p*/
	    p += n; 
                    /*dcr?: p now points n nchar further along in buf*/
                    /*note the space after the %g conversion of double currVal*/
                    /*so when next char written they will have a space between*/
	    max -= n; 

            /*dcr?: max tracks available space in buf, now decremented by n */
            /*buf holds the angle values in order of their use*/
            /*it would be nice to reorder those values for output to .map file*/
            /*e.g. so plotting of phi,tau,psi could be as phi,psi,tau ! */
            /*probably this should be done at the output stage anyway*/
            /*autobondrot output is from probe.c/rawEnumerate() where */
            /*angle values are called char *rawname  which seems to == buf */
	 }

	 /* sum up any bias functions */

	 for(f = xdb->level[i]->funcs; f; f = f->next) {
	    if (f->type == CONSTbiasfunc) {
	       bias += f->v;
	    }
	    else if (f->type == POLYbiasfunc) {
	       bias += f->v * pow(xdb->level[i]->currVal - f->ph, f->freq);
	    }
	    else if (f->type == COSbiasfunc) {
	       phi = f->freq * DEG2RAD * (xdb->level[i]->currVal - f->ph);
	       bias += f->v * 0.5 * (f->shift - cos(phi));
	    }
	 }
      }
   }
   return bias;
}